

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::array<const_float_*,_2>::array
          (array<const_float_*,_2> *this,initializer_list<const_float_*> v)

{
  long lVar1;
  
  this->values[0] = (float *)0x0;
  this->values[1] = (float *)0x0;
  for (lVar1 = 0; v._M_len * 8 != lVar1; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)this->values + lVar1) = *(undefined8 *)((long)v._M_array + lVar1);
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    array(std::initializer_list<T> v) {
        size_t i = 0;
        for (const T &val : v)
            values[i++] = val;
    }